

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

int mbedtls_asn1_get_bitstring_null(uchar **p,uchar *end,size_t *len)

{
  uchar *puVar1;
  ulong uVar2;
  int iVar3;
  
  puVar1 = *p;
  if (0 < (long)end - (long)puVar1) {
    iVar3 = -0x62;
    if (*puVar1 == '\x03') {
      *p = puVar1 + 1;
      iVar3 = mbedtls_asn1_get_len(p,end,len);
      if (iVar3 == 0) {
        uVar2 = *len;
        *len = uVar2 - 1;
        iVar3 = -0x68;
        if (1 < uVar2) {
          puVar1 = *p;
          *p = puVar1 + 1;
          iVar3 = -0x68;
          if (*puVar1 == '\0') {
            iVar3 = 0;
          }
        }
      }
    }
    return iVar3;
  }
  return -0x60;
}

Assistant:

int mbedtls_asn1_get_tag( unsigned char **p,
                  const unsigned char *end,
                  size_t *len, int tag )
{
    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    if( **p != tag )
        return( MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    (*p)++;

    return( mbedtls_asn1_get_len( p, end, len ) );
}